

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_tidy.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  char **ppcVar3;
  bool bVar4;
  
  if (1 < argc) {
    ppcVar3 = argv + 1;
    uVar2 = 2;
    do {
      __s1 = *ppcVar3;
      iVar1 = strcmp(__s1,"-p");
      if (iVar1 == 0) {
        do {
          if ((uint)argc <= uVar2) {
            return 0;
          }
          iVar1 = strcmp(argv[uVar2],"--");
          uVar2 = uVar2 + 1;
        } while (iVar1 != 0);
        main_cold_4();
        return 1;
      }
      iVar1 = strcmp(__s1,"-bad");
      if (iVar1 == 0) {
        main_cold_3();
        return 1;
      }
      iVar1 = strncmp(__s1,"--export-fixes=",0xf);
      if (iVar1 == 0) {
        __stream = fopen(__s1 + 0xf,"w");
        if (__stream == (FILE *)0x0) {
          main_cold_2();
          return 1;
        }
        fclose(__stream);
      }
      if (**ppcVar3 != '-') {
        fprintf(_stdout,"%s:0:0: warning: message [checker]\n");
        break;
      }
      ppcVar3 = ppcVar3 + 1;
      bVar4 = uVar2 != (uint)argc;
      uVar2 = uVar2 + 1;
    } while (bVar4);
  }
  main_cold_1();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  FILE* f;
  int i;
  for (i = 1; i < argc; ++i) {
    if (strcmp(argv[i], "-p") == 0) {
      // Ensure compile commands were not appended after the source file
      for (++i; i < argc; ++i) {
        if (strcmp(argv[i], "--") == 0) {
          fprintf(stderr, "Command line arguments unexpectedly appended\n");
          return 1;
        }
      }
      return 0;
    }
    if (strcmp(argv[i], "-bad") == 0) {
      fprintf(stdout, "stdout from bad command line arg '-bad'\n");
      fprintf(stderr, "stderr from bad command line arg '-bad'\n");
      return 1;
    }
    if (strncmp(argv[i], "--export-fixes=", 15) == 0) {
      f = fopen(argv[i] + 15, "w");
      if (!f) {
        fprintf(stderr, "Error opening %s for writing\n", argv[i] + 15);
        return 1;
      }
      fclose(f);
    }
    if (argv[i][0] != '-') {
      fprintf(stdout, "%s:0:0: warning: message [checker]\n", argv[i]);
      break;
    }
  }
  fprintf(stderr, "1 warning generated.\n");
  return 0;
}